

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_elements_transaction.cpp
# Opt level: O1

ConfidentialTxInReference * __thiscall
cfd::ConfidentialTransactionController::AddTxIn
          (ConfidentialTxInReference *__return_storage_ptr__,ConfidentialTransactionController *this
          ,Txid *txid,uint32_t vout,Pubkey *pubkey,uint32_t sequence)

{
  uint32_t index;
  ScriptBuilder *this_00;
  ScriptBuilder local_88;
  Script local_68;
  
  local_88._vptr_ScriptBuilder = (_func_int **)&PTR__ScriptBuilder_00733958;
  local_88.script_byte_array_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.script_byte_array_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.script_byte_array_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = core::ScriptBuilder::AppendData(&local_88,pubkey);
  core::ScriptBuilder::Build(&local_68,this_00);
  index = core::ConfidentialTransaction::AddTxIn(&this->transaction_,txid,vout,sequence,&local_68);
  core::Script::~Script(&local_68);
  local_88._vptr_ScriptBuilder = (_func_int **)&PTR__ScriptBuilder_00733958;
  if (local_88.script_byte_array_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_88.script_byte_array_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  core::ConfidentialTransaction::GetTxIn(__return_storage_ptr__,&this->transaction_,index);
  return __return_storage_ptr__;
}

Assistant:

const ConfidentialTxInReference ConfidentialTransactionController::AddTxIn(
    const Txid& txid, uint32_t vout, const Pubkey& pubkey, uint32_t sequence) {
  uint32_t index = transaction_.AddTxIn(
      txid, vout, sequence, ScriptBuilder().AppendData(pubkey).Build());
  return transaction_.GetTxIn(index);
}